

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::utia::utia(utia *this,char *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  exc *peVar3;
  reference pvVar4;
  int cnt;
  char local_228 [8];
  fstream f;
  char *filename_local;
  utia *this_local;
  
  brdf_rgb::brdf_rgb(&this->super_brdf_rgb);
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_0026ae40;
  std::vector<double,_std::allocator<double>_>::vector(&this->m_samples);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::fstream::fstream(local_228,filename,_Var2);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    peVar3 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(peVar3,"djb_error: Failed to open %s\n",filename);
    __cxa_throw(peVar3,&exc::typeinfo,exc::~exc);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_samples,0x3cc00);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_samples,0);
  std::istream::read(local_228,(long)pvVar4);
  this->m_norm = 1.0;
  normalize(this);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::fstream::~fstream(local_228);
    return;
  }
  peVar3 = (exc *)__cxa_allocate_exception(0x28);
  exc::exc(peVar3,"djb_error: Reading %s failed\n",filename);
  __cxa_throw(peVar3,&exc::typeinfo,exc::~exc);
}

Assistant:

utia::utia(const char *filename)
{
	// open file
	std::fstream f(filename, std::fstream::in | std::fstream::binary);
	if (!f.is_open())
		throw exc("djb_error: Failed to open %s\n", filename);

	// allocate memory
	int cnt = DJB__UTIA_PLANES * DJB__UTIA_NTI * DJB__UTIA_NPI
	        * DJB__UTIA_NTV * DJB__UTIA_NPV;
	m_samples.resize(cnt);

	// read data
	f.read((char *)&m_samples[0], sizeof(double) * cnt);

	// normalize
	m_norm = 1.0;
	normalize();
	if (f.fail())
		throw exc("djb_error: Reading %s failed\n", filename);
}